

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc.c
# Opt level: O1

void do_redit(CHAR_DATA *ch,char *argument)

{
  long *plVar1;
  int iVar2;
  AREA_DATA_conflict *pAVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  ROOM_INDEX_DATA *pRoomIndex;
  ROOM_INDEX_DATA *pRoom;
  char arg1 [4608];
  char acStack_1238 [4616];
  
  bVar4 = check_security(ch);
  if (!bVar4) {
    return;
  }
  pcVar6 = one_argument(argument,acStack_1238);
  pRoom = ch->in_room;
  bVar4 = check_security(ch);
  if (!bVar4) {
    return;
  }
  bVar4 = str_cmp(acStack_1238,"reset");
  if (bVar4) {
    bVar4 = str_cmp(acStack_1238,"create");
    if (bVar4) {
      atoi(acStack_1238);
      pRoomIndex = get_room_index(0);
      if ((pRoomIndex != (ROOM_INDEX_DATA *)0x0) && (bVar4 = is_switched(ch), !bVar4)) {
        iVar5 = ch->pcdata->security;
        pAVar3 = pRoomIndex->area;
        iVar2 = pAVar3->security;
        if (((iVar2 < iVar5) ||
            ((pcVar6 = strstr(pAVar3->builders,ch->name), iVar2 < iVar5 || (pcVar6 != (char *)0x0)))
            ) || (pcVar6 = strstr(pAVar3->builders,"All"), pcVar6 != (char *)0x0)) {
          char_from_room(ch);
          char_to_room(ch,pRoomIndex);
          goto LAB_0035b507;
        }
      }
      iVar5 = atoi(acStack_1238);
      if (iVar5 != 0) {
        pcVar6 = "Insufficient security to modify room, or room does not exist.\n\r";
        goto LAB_0035b521;
      }
    }
    else {
      if ((*pcVar6 == '\0') || (iVar5 = atoi(pcVar6), iVar5 == 0)) {
        pcVar6 = "Syntax:  edit room create [vnum]\n\r";
        goto LAB_0035b521;
      }
      bVar4 = redit_create(ch,pcVar6);
      if (bVar4) {
        char_from_room(ch);
        char_to_room(ch,(ROOM_INDEX_DATA *)ch->desc->pEdit);
        plVar1 = pRoom->area->area_flags;
        *plVar1 = *plVar1 | 8;
LAB_0035b507:
        pRoom = ch->in_room;
      }
    }
    bVar4 = is_switched(ch);
    if (!bVar4) {
      iVar5 = ch->pcdata->security;
      pAVar3 = pRoom->area;
      iVar2 = pAVar3->security;
      if ((((iVar2 < iVar5) || (pcVar6 = strstr(pAVar3->builders,ch->name), iVar2 < iVar5)) ||
          (pcVar6 != (char *)0x0)) ||
         (pcVar6 = strstr(pAVar3->builders,"All"), pcVar6 != (char *)0x0)) {
        ch->desc->editor = 2;
        redit_show(ch,"");
        return;
      }
    }
  }
  else {
    bVar4 = is_switched(ch);
    if (!bVar4) {
      iVar5 = ch->pcdata->security;
      pAVar3 = pRoom->area;
      iVar2 = pAVar3->security;
      if ((((iVar2 < iVar5) || (pcVar6 = strstr(pAVar3->builders,ch->name), iVar2 < iVar5)) ||
          (pcVar6 != (char *)0x0)) ||
         (pcVar6 = strstr(pAVar3->builders,"All"), pcVar6 != (char *)0x0)) {
        reset_room(pRoom);
        pcVar6 = "Room reset.\n\r";
        goto LAB_0035b521;
      }
    }
  }
  pcVar6 = "Insufficient security to modify area.\n\r";
LAB_0035b521:
  send_to_char(pcVar6,ch);
  return;
}

Assistant:

void do_redit(CHAR_DATA *ch, char *argument)
{
	ROOM_INDEX_DATA *pRoom, *pRoom2;
	char arg1[MAX_STRING_LENGTH];

	if (!check_security(ch))
		return;

	argument = one_argument(argument, arg1);

	pRoom = ch->in_room;

	if (!check_security(ch))
		return;

	if (!str_cmp(arg1, "reset"))
	{
		if (!IS_BUILDER(ch, pRoom->area))
		{
			send_to_char("Insufficient security to modify area.\n\r", ch);
			return;
		}

		reset_room(pRoom);
		send_to_char("Room reset.\n\r", ch);
		return;
	}
	else if (!str_cmp(arg1, "create"))
	{
		if (argument[0] == '\0' || atoi(argument) == 0)
		{
			send_to_char("Syntax:  edit room create [vnum]\n\r", ch);
			return;
		}

		if (redit_create(ch, argument))
		{
			char_from_room(ch);
			char_to_room(ch, (ROOM_INDEX_DATA *)ch->desc->pEdit);
			SET_BIT(pRoom->area->area_flags, AREA_CHANGED);
			pRoom = ch->in_room;
		}
	}
	else
	{
		pRoom2 = get_room_index(atoi(arg1));

		if (pRoom2 != nullptr && IS_BUILDER(ch, pRoom2->area))
		{
			char_from_room(ch);
			char_to_room(ch, pRoom2);
			pRoom = ch->in_room;
		}
		else if (atoi(arg1) != 0)
		{
			send_to_char("Insufficient security to modify room, or room does not exist.\n\r", ch);
			return;
		}
	}

	if (!IS_BUILDER(ch, pRoom->area))
	{
		send_to_char("Insufficient security to modify area.\n\r", ch);
		return;
	}

	ch->desc->editor = ED_ROOM;
	redit_show(ch, "");
}